

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  int local_18c;
  undefined1 local_188 [4];
  int i;
  secp256k1_ge d_ge;
  secp256k1_gej ai;
  secp256k1_gej d;
  secp256k1_gej *a_local;
  secp256k1_fe *z_local;
  secp256k1_fe *zr_local;
  secp256k1_ge *pre_a_local;
  int n_local;
  
  d._120_8_ = a;
  secp256k1_gej_double_var((secp256k1_gej *)&ai.infinity,a,(secp256k1_fe *)0x0);
  secp256k1_ge_set_xy((secp256k1_ge *)local_188,(secp256k1_fe *)&ai.infinity,
                      (secp256k1_fe *)(d.x.n + 4));
  secp256k1_ge_set_gej_zinv(pre_a,(secp256k1_gej *)d._120_8_,(secp256k1_fe *)(d.y.n + 4));
  secp256k1_gej_set_ge((secp256k1_gej *)&d_ge.infinity,pre_a);
  memcpy(ai.y.n + 4,(void *)(d._120_8_ + 0x50),0x28);
  memcpy(zr,d.y.n + 4,0x28);
  for (local_18c = 1; local_18c < n; local_18c = local_18c + 1) {
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)&d_ge.infinity,(secp256k1_gej *)&d_ge.infinity,
               (secp256k1_ge *)local_188,zr + local_18c);
    secp256k1_ge_set_xy(pre_a + local_18c,(secp256k1_fe *)&d_ge.infinity,
                        (secp256k1_fe *)(ai.x.n + 4));
  }
  secp256k1_fe_mul(z,(secp256k1_fe *)(ai.y.n + 4),(secp256k1_fe *)(d.y.n + 4));
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equvalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}